

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O0

void __thiscall
SQCompilation::SQCompilationContext::SQCompilationContext
          (SQCompilationContext *this,SQVM *vm,Arena *arena,SQChar *sn,char *code,size_t csize,
          Comments *comments,bool raiseError)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  byte in_stack_00000010;
  
  *in_RDI = in_RCX;
  in_RDI[1] = in_RSI;
  in_RDI[2] = in_R8;
  in_RDI[3] = in_R9;
  memset(in_RDI + 4,0,200);
  in_RDI[0x1d] = in_RDX;
  *(byte *)(in_RDI + 0x1e) = in_stack_00000010 & 1;
  sqvector<int,_unsigned_int>::sqvector
            ((sqvector<int,_unsigned_int> *)(in_RDI + 0x1f),
             (SQAllocContext)**(undefined8 **)(in_RSI + 0x128));
  in_RDI[0x22] = in_stack_00000008;
  return;
}

Assistant:

SQCompilationContext::SQCompilationContext(SQVM *vm, Arena *arena, const SQChar *sn, const char *code, size_t csize, const Comments *comments, bool raiseError)
  : _vm(vm)
  , _arena(arena)
  , _sourceName(sn)
  , _linemap(_ss(vm)->_alloc_ctx)
  , _comments(comments)
  , _code(code)
  , _codeSize(csize)
  , _raiseError(raiseError)
  , _errorjmp()
{
}